

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3WindowUpdate(Parse *pParse,Window *pList,Window *pWin,FuncDef *pFunc)

{
  sqlite3 *db;
  u8 uVar1;
  Window *pWVar2;
  ExprList *pEVar3;
  Expr *pEVar4;
  char *zFormat;
  long lVar5;
  long in_FS_OFFSET;
  Token local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((pWin->zName == (char *)0x0) || (pWin->eFrmType != '\0')) {
    sqlite3WindowChain(pParse,pWin,pList);
    uVar1 = pWin->eFrmType;
  }
  else {
    pWVar2 = windowFind(pParse,pList,pWin->zName);
    if (pWVar2 == (Window *)0x0) goto LAB_00182dbb;
    pEVar4 = (Expr *)0x0;
    pEVar3 = sqlite3ExprListDup(pParse->db,pWVar2->pPartition,0);
    pWin->pPartition = pEVar3;
    pEVar3 = sqlite3ExprListDup(pParse->db,pWVar2->pOrderBy,0);
    pWin->pOrderBy = pEVar3;
    if (pWVar2->pStart != (Expr *)0x0) {
      pEVar4 = exprDup(pParse->db,pWVar2->pStart,0,(EdupBuf *)0x0);
    }
    pWin->pStart = pEVar4;
    if (pWVar2->pEnd == (Expr *)0x0) {
      pEVar4 = (Expr *)0x0;
    }
    else {
      pEVar4 = exprDup(pParse->db,pWVar2->pEnd,0,(EdupBuf *)0x0);
    }
    pWin->pEnd = pEVar4;
    pWin->eStart = pWVar2->eStart;
    pWin->eEnd = pWVar2->eEnd;
    uVar1 = pWVar2->eFrmType;
    pWin->eFrmType = uVar1;
    pWin->eExclude = pWVar2->eExclude;
  }
  if (((uVar1 == 'Z') && ((pWin->pStart != (Expr *)0x0 || (pWin->pEnd != (Expr *)0x0)))) &&
     ((pWin->pOrderBy == (ExprList *)0x0 || (pWin->pOrderBy->nExpr != 1)))) {
    zFormat = "RANGE with offset PRECEDING/FOLLOWING requires one ORDER BY expression";
LAB_00182dad:
    sqlite3ErrorMsg(pParse,zFormat);
  }
  else if ((pFunc->funcFlags & 0x10000) != 0) {
    if (pWin->pFilter != (Expr *)0x0) {
      zFormat = "FILTER clause may only be used with aggregate window functions";
      goto LAB_00182dad;
    }
    db = pParse->db;
    lVar5 = 0x10;
    do {
      if (pFunc->zName == *(char **)((long)&sqlite3Apis.set_clientdata + lVar5)) {
        if (pWin->pStart != (Expr *)0x0) {
          sqlite3ExprDeleteNN(db,pWin->pStart);
        }
        if (pWin->pEnd != (Expr *)0x0) {
          sqlite3ExprDeleteNN(db,pWin->pEnd);
        }
        pWin->pStart = (Expr *)0x0;
        pWin->pEnd = (Expr *)0x0;
        uVar1 = (&UNK_0023b4dc)[lVar5];
        pWin->eFrmType = (&UNK_0023b4d8)[lVar5];
        pWin->eStart = uVar1;
        pWin->eEnd = *(u8 *)((long)&PTR_row_numberName_0023b4e0 + lVar5);
        pWin->eExclude = '\0';
        if (uVar1 == 'W') {
          local_48.n = 1;
          local_48._12_4_ = 0xaaaaaaaa;
          local_48.z = "1";
          pEVar4 = sqlite3ExprAlloc(db,0x9c,&local_48,0);
          pWin->pStart = pEVar4;
        }
        break;
      }
      lVar5 = lVar5 + 0x18;
    } while (lVar5 != 0xd0);
  }
  pWin->pWFunc = pFunc;
LAB_00182dbb:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WindowUpdate(
  Parse *pParse,
  Window *pList,                  /* List of named windows for this SELECT */
  Window *pWin,                   /* Window frame to update */
  FuncDef *pFunc                  /* Window function definition */
){
  if( pWin->zName && pWin->eFrmType==0 ){
    Window *p = windowFind(pParse, pList, pWin->zName);
    if( p==0 ) return;
    pWin->pPartition = sqlite3ExprListDup(pParse->db, p->pPartition, 0);
    pWin->pOrderBy = sqlite3ExprListDup(pParse->db, p->pOrderBy, 0);
    pWin->pStart = sqlite3ExprDup(pParse->db, p->pStart, 0);
    pWin->pEnd = sqlite3ExprDup(pParse->db, p->pEnd, 0);
    pWin->eStart = p->eStart;
    pWin->eEnd = p->eEnd;
    pWin->eFrmType = p->eFrmType;
    pWin->eExclude = p->eExclude;
  }else{
    sqlite3WindowChain(pParse, pWin, pList);
  }
  if( (pWin->eFrmType==TK_RANGE)
   && (pWin->pStart || pWin->pEnd)
   && (pWin->pOrderBy==0 || pWin->pOrderBy->nExpr!=1)
  ){
    sqlite3ErrorMsg(pParse,
      "RANGE with offset PRECEDING/FOLLOWING requires one ORDER BY expression"
    );
  }else
  if( pFunc->funcFlags & SQLITE_FUNC_WINDOW ){
    sqlite3 *db = pParse->db;
    if( pWin->pFilter ){
      sqlite3ErrorMsg(pParse,
          "FILTER clause may only be used with aggregate window functions"
      );
    }else{
      struct WindowUpdate {
        const char *zFunc;
        int eFrmType;
        int eStart;
        int eEnd;
      } aUp[] = {
        { row_numberName,   TK_ROWS,   TK_UNBOUNDED, TK_CURRENT },
        { dense_rankName,   TK_RANGE,  TK_UNBOUNDED, TK_CURRENT },
        { rankName,         TK_RANGE,  TK_UNBOUNDED, TK_CURRENT },
        { percent_rankName, TK_GROUPS, TK_CURRENT,   TK_UNBOUNDED },
        { cume_distName,    TK_GROUPS, TK_FOLLOWING, TK_UNBOUNDED },
        { ntileName,        TK_ROWS,   TK_CURRENT,   TK_UNBOUNDED },
        { leadName,         TK_ROWS,   TK_UNBOUNDED, TK_UNBOUNDED },
        { lagName,          TK_ROWS,   TK_UNBOUNDED, TK_CURRENT },
      };
      int i;
      for(i=0; i<ArraySize(aUp); i++){
        if( pFunc->zName==aUp[i].zFunc ){
          sqlite3ExprDelete(db, pWin->pStart);
          sqlite3ExprDelete(db, pWin->pEnd);
          pWin->pEnd = pWin->pStart = 0;
          pWin->eFrmType = aUp[i].eFrmType;
          pWin->eStart = aUp[i].eStart;
          pWin->eEnd = aUp[i].eEnd;
          pWin->eExclude = 0;
          if( pWin->eStart==TK_FOLLOWING ){
            pWin->pStart = sqlite3Expr(db, TK_INTEGER, "1");
          }
          break;
        }
      }
    }
  }
  pWin->pWFunc = pFunc;
}